

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void __thiscall IrSim::buildBB(IrSim *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_01;
  pointer piVar1;
  pointer piVar2;
  pointer psVar3;
  mapped_type_conflict *pmVar4;
  int *piVar5;
  pointer pIVar6;
  ulong uVar7;
  int *piVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  _Rb_tree_node_base *p_Var10;
  size_type sVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_02;
  iterator iVar16;
  int *piVar17;
  long lVar18;
  int iVar19;
  pointer pIVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  const_iterator __cbeg;
  int labelNo;
  int local_58;
  int local_54;
  vector<int,std::allocator<int>> *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_48;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_40;
  int local_34;
  
  local_58 = 0;
  pIVar6 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar20 = pIVar6;
  if (pIVar6 != (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_48 = &this->labels;
    local_50 = (vector<int,std::allocator<int>> *)&this->basicBlocks;
    local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->functions;
    do {
      iVar15 = pIVar20->kind;
      if ((iVar15 - 0x14U < 8) || (iVar15 == 0xe)) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](local_48,&(pIVar20->target).value);
        local_54 = *pmVar4;
        piVar1 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar2 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](&this->labelInBB,&local_54);
        *pmVar4 = (mapped_type_conflict)((ulong)((long)piVar1 - (long)piVar2) >> 2);
        iVar16._M_current =
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar16._M_current == piVar5) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_50,iVar16,&local_54);
          iVar16._M_current =
               (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar16._M_current = local_54;
          iVar16._M_current = iVar16._M_current + 1;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar16._M_current;
        }
        local_34 = local_58 + 1;
        if (iVar16._M_current == piVar5) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_50,iVar16,&local_34);
        }
        else {
          *iVar16._M_current = local_34;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar16._M_current + 1;
        }
      }
      else if (iVar15 == 0xd) {
        iVar16._M_current =
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar16._M_current ==
            (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_50,iVar16,&local_58);
        }
        else {
          *iVar16._M_current = local_58;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar16._M_current + 1;
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_40,&local_58);
      }
      pIVar20 = pIVar20 + 1;
      local_58 = local_58 + 1;
    } while (pIVar20 !=
             (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pIVar6 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this_00 = &this->basicBlocks;
  local_54 = (int)((ulong)((long)pIVar20 - (long)pIVar6) >> 3) * 0x286bca1b;
  iVar16._M_current =
       (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar16,&local_54);
    piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar16._M_current = local_54;
    piVar5 = iVar16._M_current + 1;
    (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_50 = (vector<int,std::allocator<int>> *)this_00;
  if (piVar8 != piVar5) {
    uVar7 = (long)piVar5 - (long)piVar8 >> 2;
    lVar14 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
              (piVar8,piVar5,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)piVar5 - (long)piVar8 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar8,piVar5);
    }
    else {
      piVar17 = piVar8 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar8,piVar17);
      for (; piVar17 != piVar5; piVar17 = piVar17 + 1) {
        iVar19 = *piVar17;
        iVar15 = piVar17[-1];
        piVar8 = piVar17;
        while (iVar19 <= iVar15) {
          *piVar8 = iVar15;
          piVar12 = piVar8 + -2;
          piVar8 = piVar8 + -1;
          iVar15 = *piVar12;
        }
        *piVar8 = iVar19;
      }
    }
  }
  piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar8) {
    piVar17 = piVar5 + 1;
    do {
      piVar12 = piVar17;
      if (piVar12 == piVar8) goto LAB_0010a1a3;
      piVar17 = piVar12 + 1;
    } while (piVar12[-1] != *piVar12);
    piVar13 = piVar12 + -1;
    iVar15 = piVar12[-1];
    for (; piVar17 != piVar8; piVar17 = piVar17 + 1) {
      iVar19 = *piVar17;
      if (iVar15 != iVar19) {
        piVar13[1] = iVar19;
        piVar13 = piVar13 + 1;
      }
      iVar15 = iVar19;
    }
    piVar13 = piVar13 + 1;
    if (piVar13 != piVar8) {
      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar13;
      piVar8 = piVar13;
    }
LAB_0010a1a3:
    if (piVar5 != piVar8) {
      for (p_Var10 = (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &(this->labelInBB)._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (piVar5,(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,p_Var10 + 1);
        piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(int *)&p_Var10[1].field_0x4 = (int)((ulong)((long)_Var9._M_current - (long)piVar5) >> 2);
      }
      iVar15 = (int)((ulong)((long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar19 = iVar15 + -1;
      this_01 = &this->edges;
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::resize(this_01,(long)iVar19);
      local_58 = 0;
      if (1 < iVar15) {
        local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)&this->labelInBB;
        local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &this->functions;
        do {
          pIVar20 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl
                    .super__Vector_impl_data._M_start;
          lVar14 = (long)local_58;
          lVar18 = (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar14 + 1];
          pIVar6 = pIVar20 + lVar18;
          iVar15 = pIVar20[lVar18 + -1].kind;
          if ((iVar15 - 0x14U < 8) || (iVar15 == 0xe)) {
            psVar3 = (this_01->
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->labels,&pIVar6[-1].target.value);
            pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_48,pmVar4);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       (psVar3 + lVar14),pmVar4);
          }
          if ((local_58 + 1 != iVar19) &&
             (sVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40,
                                  (((_Vector_base<int,_std::allocator<int>_> *)&local_50->field_0x0)
                                  ->_M_impl).super__Vector_impl_data._M_start + (local_58 + 1)),
             sVar11 == 0)) {
            this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      ((this_01->
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_58);
            if (pIVar6->kind == 0xe) {
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&this->labels,&(pIVar6->target).value);
              pmVar4 = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_48,pmVar4);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(this_02,pmVar4);
            }
            else {
              local_54 = local_58 + 1;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>
                        ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)this_02,&local_54);
            }
          }
          local_58 = local_58 + 1;
        } while (local_58 < iVar19);
      }
      return;
    }
  }
  __assert_fail("!basicBlocks.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                ,0x4d,"void IrSim::buildBB()");
}

Assistant:

void IrSim::buildBB() {
    int i = 0;
    for (auto it = irList.begin(); it != irList.end(); ++it, ++i) {
        int k = it->kind;
        if (k == IC_FUNC) {
            basicBlocks.push_back(i);
            functions.insert(i);
        }
        else if (isGoto(k)) {
            int labelNo = labels[it->target.value];
            labelInBB[labelNo] = (int)basicBlocks.size();
            basicBlocks.push_back(labelNo);
            basicBlocks.push_back(i + 1);
        }
    }
    basicBlocks.push_back((int)irList.size());
    std::sort(basicBlocks.begin(), basicBlocks.end(), [](int a, int b) { return a <= b; });
    auto last = std::unique(basicBlocks.begin(), basicBlocks.end());
    basicBlocks.erase(last, basicBlocks.end());
    assert(!basicBlocks.empty());

    for (auto &it : labelInBB)
        it.second = (int)(find(basicBlocks.begin(), basicBlocks.end(), it.first) - basicBlocks.begin());
    int size = (int)basicBlocks.size() - 1;
    edges.resize((size_t)size);
    for (i = 0; i < size; ++i) { // build edges
        InterCode &bbend = irList[basicBlocks[i + 1] - 1];
        InterCode &bbnext = irList[basicBlocks[i + 1]];
        if (isGoto(bbend.kind))
            edges[i].insert(labelInBB[labels[bbend.target.value]]);
        if (i + 1 != size && functions.count(basicBlocks[i + 1]) == 0) {
            if (bbnext.kind == IC_GOTO)
                edges[i].insert(labelInBB[labels[bbnext.target.value]]);
            else
                edges[i].insert(i + 1);
        }
    }
}